

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O3

IterateResult __thiscall
dit::anon_unknown_0::SeedBuilderMultipleValuesTest::iterate(SeedBuilderMultipleValuesTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  SeedBuilder *builder;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  SeedBuilder builderAB;
  SeedBuilder builderB;
  SeedBuilder builderA;
  SeedBuilder local_1b4;
  SeedBuilder local_1b0;
  SeedBuilder local_1ac;
  undefined1 local_1a8 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::SeedBuilder::SeedBuilder(&local_1ac);
  tcu::SeedBuilder::SeedBuilder(&local_1b0);
  tcu::SeedBuilder::SeedBuilder(&local_1b4);
  tcu::operator<<(&local_1ac,0x4a238ab);
  tcu::operator<<(&local_1b0,0xe455bd08);
  builder = tcu::operator<<(&local_1b4,0x4a238ab);
  tcu::operator<<(builder,0xe455bd08);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value a: ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", Seed a: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value b: ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", Seed b: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Seed ab: ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  if (local_1ac.m_hash == local_1b4.m_hash) {
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    description = "Seed seems to only depends on first value.";
  }
  else {
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    if (local_1b0.m_hash != local_1b4.m_hash) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00168698;
    }
    description = "Seed seems to only depends on second value.";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_00168698:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		const deUint32		a			= 77740203u;
		const deUint32		b			= 3830824200u;

		tcu::SeedBuilder	builderA;
		tcu::SeedBuilder	builderB;
		tcu::SeedBuilder	builderAB;

		builderA << a;
		builderB << b;

		builderAB << a << b;

		log << TestLog::Message << "Value a: " << a << ", Seed a: " << builderA.get() << TestLog::EndMessage;
		log << TestLog::Message << "Value b: " << b << ", Seed b: " << builderB.get() << TestLog::EndMessage;
		log << TestLog::Message << "Seed ab: " << builderAB.get() << TestLog::EndMessage;

		if (builderA.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on first value.");
		else if (builderB.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on second value.");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}